

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void TrimSpaces(TidyDocImpl *doc,Node *element)

{
  Node *pNVar1;
  Bool BVar2;
  Node *text;
  Node *element_local;
  TidyDocImpl *doc_local;
  
  pNVar1 = element->content;
  if ((((element == (Node *)0x0) || (element->tag == (Dict *)0x0)) ||
      (element->tag->id != TidyTag_PRE)) && (BVar2 = IsPreDescendant(element), BVar2 == no)) {
    BVar2 = prvTidynodeIsText(pNVar1);
    if (BVar2 != no) {
      TrimInitialSpace(doc,element,pNVar1);
    }
    pNVar1 = element->last;
    BVar2 = prvTidynodeIsText(pNVar1);
    if (BVar2 != no) {
      TrimTrailingSpace(doc,element,pNVar1);
    }
  }
  return;
}

Assistant:

static void TrimSpaces( TidyDocImpl* doc, Node *element)
{
    Node* text = element->content;

    if (nodeIsPRE(element) || IsPreDescendant(element))
        return;

    if (TY_(nodeIsText)(text))
        TrimInitialSpace(doc, element, text);

    text = element->last;

    if (TY_(nodeIsText)(text))
        TrimTrailingSpace(doc, element, text);
}